

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
          *other)

{
  undefined8 *puVar1;
  ulong nbCols;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  Index innerSize;
  undefined8 *puVar9;
  Index outerSize;
  long lVar10;
  long lVar11;
  Index col;
  long lVar12;
  Index inner;
  long lVar13;
  Index row;
  long lVar14;
  ulong uVar15;
  
  uVar15 = *(ulong *)(other + 8);
  nbCols = *(ulong *)(other + 0x10);
  if ((nbCols != 0 && uVar15 != 0) &&
     (auVar7 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar7 / SEXT816((long)nbCols),0) < (long)uVar15)) {
    puVar9 = (undefined8 *)
             __cxa_allocate_exception(8,other,SUB168(auVar7 % SEXT816((long)nbCols),0));
    *puVar9 = operator_delete;
    __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if ((long)(nbCols | uVar15) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * uVar15,uVar15,nbCols);
  lVar2 = *(long *)(this + 8);
  if ((lVar2 == *(long *)(other + 8)) &&
     (lVar3 = *(long *)(this + 0x10), lVar3 == *(long *)(other + 0x10))) {
    if (0 < lVar3) {
      lVar10 = 0;
      lVar11 = 0;
      lVar12 = 0;
      do {
        if (0 < lVar11) {
          *(undefined8 *)(*(long *)this + *(long *)(this + 8) * lVar12 * 8) =
               *(undefined8 *)(*(long *)other + *(long *)(other + 0x20) * lVar12 * 8);
        }
        uVar15 = lVar2 - lVar11 & 0xfffffffffffffffe;
        lVar13 = uVar15 + lVar11;
        lVar14 = lVar11;
        if (0 < (long)uVar15) {
          do {
            puVar9 = (undefined8 *)(*(long *)(other + 0x20) * lVar10 + *(long *)other + lVar14 * 8);
            uVar8 = puVar9[1];
            puVar1 = (undefined8 *)(*(long *)(this + 8) * lVar10 + *(long *)this + lVar14 * 8);
            *puVar1 = *puVar9;
            puVar1[1] = uVar8;
            lVar14 = lVar14 + 2;
          } while (lVar14 < lVar13);
        }
        if (lVar13 < lVar2) {
          lVar14 = *(long *)(this + 8);
          lVar4 = *(long *)this;
          lVar5 = *(long *)(other + 0x20);
          lVar6 = *(long *)other;
          do {
            *(undefined8 *)(lVar14 * lVar10 + lVar4 + lVar13 * 8) =
                 *(undefined8 *)(lVar5 * lVar10 + lVar6 + lVar13 * 8);
            lVar13 = lVar13 + 1;
          } while (lVar13 < lVar2);
        }
        lVar11 = (long)(lVar11 + (ulong)((uint)lVar2 & 1)) % 2;
        if (lVar2 < lVar11) {
          lVar11 = lVar2;
        }
        lVar12 = lVar12 + 1;
        lVar10 = lVar10 + 8;
      } while (lVar12 != lVar3);
    }
    return (Matrix<double,__1,__1,_0,__1,__1> *)this;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/Assign.h"
                ,0x1f2,
                "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Block<const Eigen::Matrix<double, -1, -1>>]"
               );
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }